

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_proxy.c
# Opt level: O0

void Curl_connect_done(Curl_easy *data)

{
  http_connect_state *phVar1;
  http_connect_state *s;
  connectdata *conn;
  Curl_easy *data_local;
  
  phVar1 = data->conn->connect_state;
  if ((phVar1 != (http_connect_state *)0x0) && (phVar1->tunnel_state != TUNNEL_EXIT)) {
    phVar1->tunnel_state = TUNNEL_EXIT;
    Curl_dyn_free(&phVar1->rcvbuf);
    Curl_dyn_free(&phVar1->req);
    (data->req).p = (anon_union_8_12_57927972_for_p)phVar1->prot_save;
    (data->info).httpcode = 0;
    *(ushort *)&(data->req).field_0xd9 = *(ushort *)&(data->req).field_0xd9 & 0xfff7;
    Curl_infof(data,"CONNECT phase completed");
  }
  return;
}

Assistant:

void Curl_connect_done(struct Curl_easy *data)
{
  struct connectdata *conn = data->conn;
  struct http_connect_state *s = conn->connect_state;
  if(s && (s->tunnel_state != TUNNEL_EXIT)) {
    s->tunnel_state = TUNNEL_EXIT;
    Curl_dyn_free(&s->rcvbuf);
    Curl_dyn_free(&s->req);

    /* restore the protocol pointer */
    data->req.p.http = s->prot_save;
    data->info.httpcode = 0; /* clear it as it might've been used for the
                                proxy */
    data->req.ignorebody = FALSE;
#ifdef USE_HYPER
    data->state.hconnect = FALSE;
#endif
    infof(data, "CONNECT phase completed");
  }
}